

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

void FIX::process_sleep(double s)

{
  int iVar1;
  double dVar2;
  timespec time;
  double intpart;
  timespec remainder;
  timespec local_38;
  double local_28;
  timespec local_20;
  
  dVar2 = modf(s,&local_28);
  local_38.tv_nsec = (long)(dVar2 * 1000000000.0);
  local_38.tv_sec = (__time_t)(int)local_28;
  while( true ) {
    iVar1 = nanosleep(&local_38,&local_20);
    if (iVar1 != -1) break;
    local_38.tv_sec = local_20.tv_sec;
    local_38.tv_nsec = local_20.tv_nsec;
  }
  return;
}

Assistant:

void process_sleep(double s) {
#ifdef _MSC_VER
  Sleep((long)(s * 1000));
#else
  timespec time, remainder;
  double intpart;
  time.tv_nsec = (long)(modf(s, &intpart) * 1e9);
  time.tv_sec = (int)intpart;
  while (nanosleep(&time, &remainder) == -1) {
    time = remainder;
  }
#endif
}